

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFont::AddRemapChar(ImFont *this,ImWchar dst,ImWchar src,bool overwrite_dst)

{
  wchar_t wVar1;
  unsigned_short *puVar2;
  float *pfVar3;
  float local_30;
  unsigned_short local_2a;
  uint index_size;
  bool overwrite_dst_local;
  ImWchar src_local;
  ImWchar dst_local;
  ImFont_conflict *this_local;
  
  if ((this->IndexLookup).Size < L'\x01') {
    __assert_fail("IndexLookup.Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                  ,0xce2,"void ImFont::AddRemapChar(ImWchar, ImWchar, bool)");
  }
  wVar1 = (this->IndexLookup).Size;
  if (((((uint)wVar1 <= (uint)dst) || ((this->IndexLookup).Data[dst] != 0xffff)) || (overwrite_dst))
     && (((uint)src < (uint)wVar1 || ((uint)dst < (uint)wVar1)))) {
    GrowIndex(this,dst + 1);
    if ((uint)src < (uint)wVar1) {
      local_2a = (this->IndexLookup).Data[src];
    }
    else {
      local_2a = 0xffff;
    }
    puVar2 = ImVector<unsigned_short>::operator[]
                       ((ImVector<unsigned_short> *)&this->IndexLookup,(uint)dst);
    *puVar2 = local_2a;
    if ((uint)src < (uint)wVar1) {
      local_30 = (this->IndexAdvanceX).Data[src];
    }
    else {
      local_30 = 1.0;
    }
    pfVar3 = ImVector<float>::operator[]((ImVector<float> *)this,(uint)dst);
    *pfVar3 = local_30;
  }
  return;
}

Assistant:

void ImFont::AddRemapChar(ImWchar dst, ImWchar src, bool overwrite_dst)
{
    IM_ASSERT(IndexLookup.Size > 0);    // Currently this can only be called AFTER the font has been built, aka after calling ImFontAtlas::GetTexDataAs*() function.
    unsigned int index_size = (unsigned int)IndexLookup.Size;

    if (dst < index_size && IndexLookup.Data[dst] == (ImWchar)-1 && !overwrite_dst) // 'dst' already exists
        return;
    if (src >= index_size && dst >= index_size) // both 'dst' and 'src' don't exist -> no-op
        return;

    GrowIndex(dst + 1);
    IndexLookup[dst] = (src < index_size) ? IndexLookup.Data[src] : (ImWchar)-1;
    IndexAdvanceX[dst] = (src < index_size) ? IndexAdvanceX.Data[src] : 1.0f;
}